

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

ContinueBlockType __thiscall
diligent_spirv_cross::Compiler::continue_block_type(Compiler *this,SPIRBlock *block)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  TypedID<(diligent_spirv_cross::Types)6> TVar4;
  SPIRBlock *to;
  SPIRBlock *from;
  SPIRBlock *from_00;
  SPIRBlock *to_00;
  bool local_95;
  bool local_8d;
  bool local_86;
  bool local_85;
  bool local_7d;
  bool local_77;
  bool local_76;
  bool local_75;
  bool negative_do_while;
  bool positive_do_while;
  bool flush_phi_to_true;
  bool flush_phi_to_false;
  SPIRBlock *merge_block;
  SPIRBlock *true_block;
  SPIRBlock *false_block;
  SPIRBlock *dominator;
  SPIRBlock *local_20;
  SPIRBlock *block_local;
  Compiler *this_local;
  
  if ((block->complex_continue & 1U) == 0) {
    if (block->merge == MergeLoop) {
      this_local._4_4_ = WhileLoop;
    }
    else {
      local_20 = block;
      block_local = (SPIRBlock *)this;
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->loop_dominator);
      TypedID<(diligent_spirv_cross::Types)6>::TypedID
                ((TypedID<(diligent_spirv_cross::Types)6> *)((long)&dominator + 4),0xffffffff);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&dominator + 4));
      if (uVar2 == uVar3) {
        this_local._4_4_ = ComplexLoop;
      }
      else {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_20->loop_dominator);
        to = get<diligent_spirv_cross::SPIRBlock>(this,uVar2);
        bVar1 = execution_is_noop(this,local_20,to);
        if (bVar1) {
          this_local._4_4_ = WhileLoop;
        }
        else {
          bVar1 = execution_is_branchless(this,local_20,to);
          if (bVar1) {
            this_local._4_4_ = ForLoop;
          }
          else {
            uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_20->false_block);
            from = maybe_get<diligent_spirv_cross::SPIRBlock>(this,uVar2);
            uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_20->true_block);
            from_00 = maybe_get<diligent_spirv_cross::SPIRBlock>(this,uVar2);
            uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&to->merge_block);
            to_00 = maybe_get<diligent_spirv_cross::SPIRBlock>(this,uVar2);
            local_75 = false;
            if (from != (SPIRBlock *)0x0) {
              TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(local_20->super_IVariant).self)
              ;
              local_75 = flush_phi_required(this,(BlockID)TVar4.id,
                                            (BlockID)(local_20->false_block).id);
            }
            local_76 = false;
            if (from_00 != (SPIRBlock *)0x0) {
              TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(local_20->super_IVariant).self)
              ;
              local_76 = flush_phi_required(this,(BlockID)TVar4.id,
                                            (BlockID)(local_20->true_block).id);
            }
            if ((local_75 == false) && (local_76 == false)) {
              uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_20->true_block);
              uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(to->super_IVariant).self);
              local_77 = false;
              if (uVar2 == uVar3) {
                uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_20->false_block);
                uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&to->merge_block);
                local_7d = true;
                if (uVar2 != uVar3) {
                  local_85 = false;
                  if ((from != (SPIRBlock *)0x0) && (local_85 = false, to_00 != (SPIRBlock *)0x0)) {
                    local_85 = execution_is_noop(this,from,to_00);
                  }
                  local_7d = local_85;
                }
                local_77 = local_7d;
              }
              uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_20->false_block);
              uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(to->super_IVariant).self);
              local_86 = false;
              if (uVar2 == uVar3) {
                uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_20->true_block);
                uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&to->merge_block);
                local_8d = true;
                if (uVar2 != uVar3) {
                  local_95 = false;
                  if ((from_00 != (SPIRBlock *)0x0) && (local_95 = false, to_00 != (SPIRBlock *)0x0)
                     ) {
                    local_95 = execution_is_noop(this,from_00,to_00);
                  }
                  local_8d = local_95;
                }
                local_86 = local_8d;
              }
              if (((local_20->merge == MergeNone) &&
                  (*(int *)&(local_20->super_IVariant).field_0xc == 2)) &&
                 ((local_77 != false || (local_86 != false)))) {
                this_local._4_4_ = DoWhileLoop;
              }
              else {
                this_local._4_4_ = ComplexLoop;
              }
            }
            else {
              this_local._4_4_ = ComplexLoop;
            }
          }
        }
      }
    }
  }
  else {
    this_local._4_4_ = ComplexLoop;
  }
  return this_local._4_4_;
}

Assistant:

SPIRBlock::ContinueBlockType Compiler::continue_block_type(const SPIRBlock &block) const
{
	// The block was deemed too complex during code emit, pick conservative fallback paths.
	if (block.complex_continue)
		return SPIRBlock::ComplexLoop;

	// In older glslang output continue block can be equal to the loop header.
	// In this case, execution is clearly branchless, so just assume a while loop header here.
	if (block.merge == SPIRBlock::MergeLoop)
		return SPIRBlock::WhileLoop;

	if (block.loop_dominator == BlockID(SPIRBlock::NoDominator))
	{
		// Continue block is never reached from CFG.
		return SPIRBlock::ComplexLoop;
	}

	auto &dominator = get<SPIRBlock>(block.loop_dominator);

	if (execution_is_noop(block, dominator))
		return SPIRBlock::WhileLoop;
	else if (execution_is_branchless(block, dominator))
		return SPIRBlock::ForLoop;
	else
	{
		const auto *false_block = maybe_get<SPIRBlock>(block.false_block);
		const auto *true_block = maybe_get<SPIRBlock>(block.true_block);
		const auto *merge_block = maybe_get<SPIRBlock>(dominator.merge_block);

		// If we need to flush Phi in this block, we cannot have a DoWhile loop.
		bool flush_phi_to_false = false_block && flush_phi_required(block.self, block.false_block);
		bool flush_phi_to_true = true_block && flush_phi_required(block.self, block.true_block);
		if (flush_phi_to_false || flush_phi_to_true)
			return SPIRBlock::ComplexLoop;

		bool positive_do_while = block.true_block == dominator.self &&
		                         (block.false_block == dominator.merge_block ||
		                          (false_block && merge_block && execution_is_noop(*false_block, *merge_block)));

		bool negative_do_while = block.false_block == dominator.self &&
		                         (block.true_block == dominator.merge_block ||
		                          (true_block && merge_block && execution_is_noop(*true_block, *merge_block)));

		if (block.merge == SPIRBlock::MergeNone && block.terminator == SPIRBlock::Select &&
		    (positive_do_while || negative_do_while))
		{
			return SPIRBlock::DoWhileLoop;
		}
		else
			return SPIRBlock::ComplexLoop;
	}
}